

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_schnorrsig_verify
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_xonly_pubkey *pubkey)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  int iVar219;
  ulong uVar220;
  ulong uVar221;
  ulong uVar222;
  ulong uVar223;
  ulong uVar224;
  ulong uVar225;
  ulong uVar226;
  ulong uVar227;
  ulong uVar228;
  ulong uVar229;
  int overflow;
  secp256k1_scalar s;
  uchar buf [32];
  secp256k1_scalar e;
  secp256k1_fe rx;
  secp256k1_ge pk;
  secp256k1_gej pkj;
  int local_2cc;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  secp256k1_scalar local_2a8;
  ulong local_288;
  ulong uStack_280;
  ulong local_278;
  ulong uStack_270;
  uint64_t local_268;
  secp256k1_fe local_260;
  undefined4 local_238;
  secp256k1_gej local_228;
  uchar local_1a8 [32];
  secp256k1_scalar local_188;
  secp256k1_fe local_168;
  secp256k1_fe local_138;
  secp256k1_ge local_110;
  undefined1 local_b8 [104];
  undefined1 local_50 [16];
  int local_40;
  
  if (sig64 == (uchar *)0x0) {
    secp256k1_schnorrsig_verify_cold_3();
  }
  else if (msglen == 0 || msg != (uchar *)0x0) {
    if (pubkey == (secp256k1_xonly_pubkey *)0x0) {
      secp256k1_schnorrsig_verify_cold_1();
    }
    else {
      secp256k1_fe_impl_set_b32_mod(&local_168,sig64);
      if (((0xffffefffffc2e < local_168.n[0]) && (local_168.n[4] == 0xffffffffffff)) &&
         ((local_168.n[3] & local_168.n[1] & local_168.n[2]) == 0xfffffffffffff)) {
        return 0;
      }
      local_2c8 = local_168.n[0];
      uStack_2c0 = local_168.n[1];
      local_2b8 = local_168.n[2];
      uStack_2b0 = local_168.n[3];
      secp256k1_scalar_set_b32(&local_2a8,sig64 + 0x20,&local_2cc);
      if ((local_2cc == 0) &&
         (iVar219 = secp256k1_pubkey_load(ctx,&local_110,(secp256k1_pubkey *)pubkey), iVar219 != 0))
      {
        secp256k1_fe_impl_get_b32(local_1a8,&local_110.x);
        secp256k1_schnorrsig_challenge(&local_188,sig64,msg,msglen,local_1a8);
        secp256k1_scalar_negate(&local_188,&local_188);
        local_40 = local_110.infinity;
        local_b8._0_8_ = local_110.x.n[0];
        local_b8._8_8_ = local_110.x.n[1];
        local_b8._16_8_ = local_110.x.n[2];
        local_b8._24_8_ = local_110.x.n[3];
        local_b8._32_8_ = local_110.x.n[4];
        local_b8._40_8_ = local_110.y.n[0];
        local_b8._48_8_ = local_110.y.n[1];
        local_b8._56_8_ = local_110.y.n[2];
        local_b8._64_8_ = local_110.y.n[3];
        local_b8._72_8_ = local_110.y.n[4];
        local_b8._80_8_ = 1;
        local_b8._88_16_ = (undefined1  [16])0x0;
        local_50 = (undefined1  [16])0x0;
        secp256k1_ecmult(&local_228,(secp256k1_gej *)local_b8,&local_188,&local_2a8);
        if (local_228.infinity == 0) {
          secp256k1_fe_impl_inv_var(&local_228.z,&local_228.z);
          uVar220 = local_228.z.n[0] * 2;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_228.z.n[3];
          auVar115._8_8_ = 0;
          auVar115._0_8_ = uVar220;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_228.z.n[2];
          auVar116._8_8_ = 0;
          auVar116._0_8_ = local_228.z.n[1] * 2;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_228.z.n[4];
          auVar117._8_8_ = 0;
          auVar117._0_8_ = local_228.z.n[4];
          auVar4._8_8_ = 0;
          auVar4._0_8_ = SUB168(auVar3 * auVar117,0);
          auVar1 = auVar4 * ZEXT816(0x1000003d10) + auVar2 * auVar116 + auVar1 * auVar115;
          uVar221 = local_228.z.n[4] * 2;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar221;
          auVar118._8_8_ = 0;
          auVar118._0_8_ = local_228.z.n[0];
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_228.z.n[3];
          auVar119._8_8_ = 0;
          auVar119._0_8_ = local_228.z.n[1] * 2;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_228.z.n[2];
          auVar120._8_8_ = 0;
          auVar120._0_8_ = local_228.z.n[2];
          auVar8._8_8_ = 0;
          auVar8._0_8_ = SUB168(auVar3 * auVar117,8);
          auVar5 = auVar8 * ZEXT816(0x1000003d10000) +
                   auVar5 * auVar118 + auVar7 * auVar120 + auVar6 * auVar119 + (auVar1 >> 0x34);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_228.z.n[0];
          auVar121._8_8_ = 0;
          auVar121._0_8_ = local_228.z.n[0];
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar221;
          auVar122._8_8_ = 0;
          auVar122._0_8_ = local_228.z.n[1];
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_228.z.n[3];
          auVar123._8_8_ = 0;
          auVar123._0_8_ = local_228.z.n[2] * 2;
          auVar3 = auVar11 * auVar123 + auVar10 * auVar122 + (auVar5 >> 0x34);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar5._6_2_ & 0xf);
          auVar2 = auVar9 * auVar121 + auVar12 * ZEXT816(0x1000003d1);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_228.z.n[1];
          auVar124._8_8_ = 0;
          auVar124._0_8_ = uVar220;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar221;
          auVar125._8_8_ = 0;
          auVar125._0_8_ = local_228.z.n[2];
          auVar15._8_8_ = 0;
          auVar15._0_8_ = local_228.z.n[3];
          auVar126._8_8_ = 0;
          auVar126._0_8_ = local_228.z.n[3];
          auVar3 = auVar14 * auVar125 + auVar15 * auVar126 + (auVar3 >> 0x34);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
          auVar6 = auVar16 * ZEXT816(0x1000003d10) + auVar13 * auVar124 + (auVar2 >> 0x34);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_228.z.n[2];
          auVar127._8_8_ = 0;
          auVar127._0_8_ = uVar220;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_228.z.n[1];
          auVar128._8_8_ = 0;
          auVar128._0_8_ = local_228.z.n[1];
          auVar19._8_8_ = 0;
          auVar19._0_8_ = uVar221;
          auVar129._8_8_ = 0;
          auVar129._0_8_ = local_228.z.n[3];
          auVar3 = auVar19 * auVar129 + (auVar3 >> 0x34);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = auVar3._0_8_;
          auVar4 = auVar17 * auVar127 + auVar18 * auVar128 + auVar20 * ZEXT816(0x1000003d10) +
                   (auVar6 >> 0x34);
          auVar7 = auVar4 >> 0x34;
          auVar208._8_8_ = auVar7._8_8_;
          auVar208._0_8_ = auVar1._0_8_ & 0xffffffffffffe;
          auVar209._8_8_ = 0;
          auVar209._0_8_ = auVar7._0_8_;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = auVar3._8_8_;
          auVar209 = auVar21 * ZEXT816(0x1000003d10000) + auVar208 + auVar209;
          uVar220 = auVar209._0_8_;
          uVar226 = (auVar209._8_8_ << 0xc | uVar220 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
          uVar220 = uVar220 & 0xfffffffffffff;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = uVar220;
          auVar130._8_8_ = 0;
          auVar130._0_8_ = local_228.z.n[0];
          uVar228 = auVar4._0_8_ & 0xfffffffffffff;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar228;
          auVar131._8_8_ = 0;
          auVar131._0_8_ = local_228.z.n[1];
          uVar225 = auVar6._0_8_ & 0xfffffffffffff;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar225;
          auVar132._8_8_ = 0;
          auVar132._0_8_ = local_228.z.n[2];
          uVar229 = auVar2._0_8_ & 0xfffffffffffff;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar229;
          auVar133._8_8_ = 0;
          auVar133._0_8_ = local_228.z.n[3];
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar226;
          auVar134._8_8_ = 0;
          auVar134._0_8_ = local_228.z.n[4];
          auVar27._8_8_ = 0;
          auVar27._0_8_ = SUB168(auVar26 * auVar134,0);
          auVar1 = auVar27 * ZEXT816(0x1000003d10) +
                   auVar22 * auVar130 + auVar23 * auVar131 + auVar25 * auVar133 + auVar24 * auVar132
          ;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar226;
          auVar135._8_8_ = 0;
          auVar135._0_8_ = local_228.z.n[0];
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar220;
          auVar136._8_8_ = 0;
          auVar136._0_8_ = local_228.z.n[1];
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar228;
          auVar137._8_8_ = 0;
          auVar137._0_8_ = local_228.z.n[2];
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar225;
          auVar138._8_8_ = 0;
          auVar138._0_8_ = local_228.z.n[3];
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar229;
          auVar139._8_8_ = 0;
          auVar139._0_8_ = local_228.z.n[4];
          auVar33._8_8_ = 0;
          auVar33._0_8_ = SUB168(auVar26 * auVar134,8);
          auVar2 = auVar33 * ZEXT816(0x1000003d10000) +
                   auVar28 * auVar135 +
                   auVar29 * auVar136 + auVar30 * auVar137 + auVar32 * auVar139 + auVar31 * auVar138
                   + (auVar1 >> 0x34);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar229;
          auVar140._8_8_ = 0;
          auVar140._0_8_ = local_228.z.n[0];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar226;
          auVar141._8_8_ = 0;
          auVar141._0_8_ = local_228.z.n[1];
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar220;
          auVar142._8_8_ = 0;
          auVar142._0_8_ = local_228.z.n[2];
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar228;
          auVar143._8_8_ = 0;
          auVar143._0_8_ = local_228.z.n[3];
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar225;
          auVar144._8_8_ = 0;
          auVar144._0_8_ = local_228.z.n[4];
          auVar3 = (auVar2 >> 0x34) +
                   auVar38 * auVar144 + auVar37 * auVar143 + auVar36 * auVar142 + auVar35 * auVar141
          ;
          uVar221 = auVar3._0_8_;
          uVar227 = auVar3._8_8_;
          auVar210._8_8_ = uVar227 >> 0x34;
          auVar210._0_8_ = uVar227 * 0x1000 | uVar221 >> 0x34;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar221 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar2._6_2_ & 0xf);
          auVar3 = auVar34 * auVar140 + auVar39 * ZEXT816(0x1000003d1);
          uVar222 = auVar3._0_8_;
          uVar221 = auVar3._8_8_;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar225;
          auVar145._8_8_ = 0;
          auVar145._0_8_ = local_228.z.n[0];
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar229;
          auVar146._8_8_ = 0;
          auVar146._0_8_ = local_228.z.n[1];
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar226;
          auVar147._8_8_ = 0;
          auVar147._0_8_ = local_228.z.n[2];
          auVar205._8_8_ = uVar221 >> 0x34;
          auVar205._0_8_ = uVar221 * 0x1000 | uVar222 >> 0x34;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar220;
          auVar148._8_8_ = 0;
          auVar148._0_8_ = local_228.z.n[3];
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar228;
          auVar149._8_8_ = 0;
          auVar149._0_8_ = local_228.z.n[4];
          auVar210 = auVar42 * auVar147 + auVar44 * auVar149 + auVar43 * auVar148 + auVar210;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = auVar210._0_8_ & 0xfffffffffffff;
          auVar205 = auVar45 * ZEXT816(0x1000003d10) + auVar40 * auVar145 + auVar41 * auVar146 +
                     auVar205;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = uVar228;
          auVar150._8_8_ = 0;
          auVar150._0_8_ = local_228.z.n[0];
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar225;
          auVar151._8_8_ = 0;
          auVar151._0_8_ = local_228.z.n[1];
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar229;
          auVar152._8_8_ = 0;
          auVar152._0_8_ = local_228.z.n[2];
          auVar49._8_8_ = 0;
          auVar49._0_8_ = uVar226;
          auVar153._8_8_ = 0;
          auVar153._0_8_ = local_228.z.n[3];
          auVar50._8_8_ = 0;
          auVar50._0_8_ = uVar220;
          auVar154._8_8_ = 0;
          auVar154._0_8_ = local_228.z.n[4];
          auVar3 = auVar50 * auVar154 + auVar49 * auVar153 + (auVar210 >> 0x34);
          auVar51._8_8_ = 0;
          auVar51._0_8_ = auVar3._0_8_;
          auVar4 = auVar51 * ZEXT816(0x1000003d10) +
                   auVar46 * auVar150 + auVar48 * auVar152 + auVar47 * auVar151 + (auVar205 >> 0x34)
          ;
          auVar5 = auVar4 >> 0x34;
          auVar212._8_8_ = 0;
          auVar212._0_8_ = auVar5._0_8_;
          auVar52._8_8_ = 0;
          auVar52._0_8_ = auVar3._8_8_;
          auVar211._8_8_ = auVar5._8_8_;
          auVar211._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
          auVar212 = auVar52 * ZEXT816(0x1000003d10000) + auVar211 + auVar212;
          uVar221 = auVar212._0_8_;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = uVar220;
          auVar155._8_8_ = 0;
          auVar155._0_8_ = local_228.x.n[0];
          auVar54._8_8_ = 0;
          auVar54._0_8_ = uVar228;
          auVar156._8_8_ = 0;
          auVar156._0_8_ = local_228.x.n[1];
          auVar55._8_8_ = 0;
          auVar55._0_8_ = uVar225;
          auVar157._8_8_ = 0;
          auVar157._0_8_ = local_228.x.n[2];
          auVar56._8_8_ = 0;
          auVar56._0_8_ = uVar229;
          auVar158._8_8_ = 0;
          auVar158._0_8_ = local_228.x.n[3];
          auVar57._8_8_ = 0;
          auVar57._0_8_ = uVar226;
          auVar159._8_8_ = 0;
          auVar159._0_8_ = local_228.x.n[4];
          auVar58._8_8_ = 0;
          auVar58._0_8_ = SUB168(auVar57 * auVar159,0);
          uVar223 = (auVar212._8_8_ << 0xc | uVar221 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
          auVar1 = auVar58 * ZEXT816(0x1000003d10) +
                   auVar54 * auVar156 + auVar56 * auVar158 + auVar55 * auVar157 + auVar53 * auVar155
          ;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar226;
          auVar160._8_8_ = 0;
          auVar160._0_8_ = local_228.x.n[0];
          auVar60._8_8_ = 0;
          auVar60._0_8_ = uVar220;
          auVar161._8_8_ = 0;
          auVar161._0_8_ = local_228.x.n[1];
          auVar61._8_8_ = 0;
          auVar61._0_8_ = uVar228;
          auVar162._8_8_ = 0;
          auVar162._0_8_ = local_228.x.n[2];
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uVar225;
          auVar163._8_8_ = 0;
          auVar163._0_8_ = local_228.x.n[3];
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uVar229;
          auVar164._8_8_ = 0;
          auVar164._0_8_ = local_228.x.n[4];
          auVar64._8_8_ = 0;
          auVar64._0_8_ = SUB168(auVar57 * auVar159,8);
          auVar2 = auVar64 * ZEXT816(0x1000003d10000) +
                   auVar60 * auVar161 + auVar61 * auVar162 + auVar63 * auVar164 + auVar62 * auVar163
                   + auVar59 * auVar160 + (auVar1 >> 0x34);
          auVar65._8_8_ = 0;
          auVar65._0_8_ = uVar229;
          auVar165._8_8_ = 0;
          auVar165._0_8_ = local_228.x.n[0];
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uVar226;
          auVar166._8_8_ = 0;
          auVar166._0_8_ = local_228.x.n[1];
          auVar67._8_8_ = 0;
          auVar67._0_8_ = uVar220;
          auVar167._8_8_ = 0;
          auVar167._0_8_ = local_228.x.n[2];
          auVar68._8_8_ = 0;
          auVar68._0_8_ = uVar228;
          auVar168._8_8_ = 0;
          auVar168._0_8_ = local_228.x.n[3];
          auVar69._8_8_ = 0;
          auVar69._0_8_ = uVar225;
          auVar169._8_8_ = 0;
          auVar169._0_8_ = local_228.x.n[4];
          auVar3 = (auVar2 >> 0x34) +
                   auVar69 * auVar169 + auVar68 * auVar168 + auVar67 * auVar167 + auVar66 * auVar166
          ;
          uVar227 = auVar3._0_8_;
          uVar224 = auVar3._8_8_;
          auVar213._8_8_ = uVar224 >> 0x34;
          auVar213._0_8_ = uVar224 * 0x1000 | uVar227 >> 0x34;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = uVar227 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar2._6_2_ & 0xf);
          auVar3 = auVar70 * ZEXT816(0x1000003d1) + auVar65 * auVar165;
          uVar227 = auVar3._0_8_;
          uVar224 = auVar3._8_8_;
          local_288 = uVar227 & 0xfffffffffffff;
          auVar71._8_8_ = 0;
          auVar71._0_8_ = uVar225;
          auVar170._8_8_ = 0;
          auVar170._0_8_ = local_228.x.n[0];
          auVar72._8_8_ = 0;
          auVar72._0_8_ = uVar229;
          auVar171._8_8_ = 0;
          auVar171._0_8_ = local_228.x.n[1];
          auVar73._8_8_ = 0;
          auVar73._0_8_ = uVar226;
          auVar172._8_8_ = 0;
          auVar172._0_8_ = local_228.x.n[2];
          auVar206._8_8_ = uVar224 >> 0x34;
          auVar206._0_8_ = uVar224 * 0x1000 | uVar227 >> 0x34;
          auVar74._8_8_ = 0;
          auVar74._0_8_ = uVar220;
          auVar173._8_8_ = 0;
          auVar173._0_8_ = local_228.x.n[3];
          auVar75._8_8_ = 0;
          auVar75._0_8_ = uVar228;
          auVar174._8_8_ = 0;
          auVar174._0_8_ = local_228.x.n[4];
          auVar213 = auVar73 * auVar172 + auVar75 * auVar174 + auVar74 * auVar173 + auVar213;
          auVar76._8_8_ = 0;
          auVar76._0_8_ = auVar213._0_8_ & 0xfffffffffffff;
          auVar206 = auVar76 * ZEXT816(0x1000003d10) + auVar72 * auVar171 + auVar71 * auVar170 +
                     auVar206;
          uStack_280 = auVar206._0_8_ & 0xfffffffffffff;
          auVar77._8_8_ = 0;
          auVar77._0_8_ = uVar228;
          auVar175._8_8_ = 0;
          auVar175._0_8_ = local_228.x.n[0];
          auVar78._8_8_ = 0;
          auVar78._0_8_ = uVar225;
          auVar176._8_8_ = 0;
          auVar176._0_8_ = local_228.x.n[1];
          auVar79._8_8_ = 0;
          auVar79._0_8_ = uVar229;
          auVar177._8_8_ = 0;
          auVar177._0_8_ = local_228.x.n[2];
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar226;
          auVar178._8_8_ = 0;
          auVar178._0_8_ = local_228.x.n[3];
          auVar81._8_8_ = 0;
          auVar81._0_8_ = uVar220;
          auVar179._8_8_ = 0;
          auVar179._0_8_ = local_228.x.n[4];
          auVar3 = auVar81 * auVar179 + auVar80 * auVar178 + (auVar213 >> 0x34);
          auVar82._8_8_ = 0;
          auVar82._0_8_ = auVar3._0_8_;
          auVar5 = auVar82 * ZEXT816(0x1000003d10) +
                   auVar77 * auVar175 + auVar79 * auVar177 + auVar78 * auVar176 + (auVar206 >> 0x34)
          ;
          auVar6 = auVar5 >> 0x34;
          auVar215._8_8_ = 0;
          auVar215._0_8_ = auVar6._0_8_;
          local_278 = auVar5._0_8_ & 0xfffffffffffff;
          auVar83._8_8_ = 0;
          auVar83._0_8_ = auVar3._8_8_;
          auVar214._8_8_ = auVar6._8_8_;
          auVar214._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
          auVar215 = auVar83 * ZEXT816(0x1000003d10000) + auVar214 + auVar215;
          uVar220 = auVar215._0_8_;
          uStack_270 = uVar220 & 0xfffffffffffff;
          local_268 = (auVar215._8_8_ << 0xc | uVar220 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
          uVar221 = uVar221 & 0xfffffffffffff;
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uVar221;
          auVar180._8_8_ = 0;
          auVar180._0_8_ = local_228.y.n[0];
          uVar220 = auVar4._0_8_ & 0xfffffffffffff;
          auVar85._8_8_ = 0;
          auVar85._0_8_ = uVar220;
          auVar181._8_8_ = 0;
          auVar181._0_8_ = local_228.y.n[1];
          uVar227 = auVar205._0_8_ & 0xfffffffffffff;
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar227;
          auVar182._8_8_ = 0;
          auVar182._0_8_ = local_228.y.n[2];
          uVar222 = uVar222 & 0xfffffffffffff;
          auVar87._8_8_ = 0;
          auVar87._0_8_ = uVar222;
          auVar183._8_8_ = 0;
          auVar183._0_8_ = local_228.y.n[3];
          auVar88._8_8_ = 0;
          auVar88._0_8_ = uVar223;
          auVar184._8_8_ = 0;
          auVar184._0_8_ = local_228.y.n[4];
          auVar89._8_8_ = 0;
          auVar89._0_8_ = SUB168(auVar88 * auVar184,0);
          auVar1 = auVar89 * ZEXT816(0x1000003d10) +
                   auVar84 * auVar180 + auVar85 * auVar181 + auVar87 * auVar183 + auVar86 * auVar182
          ;
          auVar90._8_8_ = 0;
          auVar90._0_8_ = uVar223;
          auVar185._8_8_ = 0;
          auVar185._0_8_ = local_228.y.n[0];
          auVar91._8_8_ = 0;
          auVar91._0_8_ = uVar221;
          auVar186._8_8_ = 0;
          auVar186._0_8_ = local_228.y.n[1];
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar220;
          auVar187._8_8_ = 0;
          auVar187._0_8_ = local_228.y.n[2];
          auVar93._8_8_ = 0;
          auVar93._0_8_ = uVar227;
          auVar188._8_8_ = 0;
          auVar188._0_8_ = local_228.y.n[3];
          auVar94._8_8_ = 0;
          auVar94._0_8_ = uVar222;
          auVar189._8_8_ = 0;
          auVar189._0_8_ = local_228.y.n[4];
          auVar95._8_8_ = 0;
          auVar95._0_8_ = SUB168(auVar88 * auVar184,8);
          auVar2 = auVar95 * ZEXT816(0x1000003d10000) +
                   auVar90 * auVar185 +
                   auVar91 * auVar186 + auVar92 * auVar187 + auVar94 * auVar189 + auVar93 * auVar188
                   + (auVar1 >> 0x34);
          auVar96._8_8_ = 0;
          auVar96._0_8_ = uVar222;
          auVar190._8_8_ = 0;
          auVar190._0_8_ = local_228.y.n[0];
          auVar97._8_8_ = 0;
          auVar97._0_8_ = uVar223;
          auVar191._8_8_ = 0;
          auVar191._0_8_ = local_228.y.n[1];
          auVar98._8_8_ = 0;
          auVar98._0_8_ = uVar221;
          auVar192._8_8_ = 0;
          auVar192._0_8_ = local_228.y.n[2];
          auVar99._8_8_ = 0;
          auVar99._0_8_ = uVar220;
          auVar193._8_8_ = 0;
          auVar193._0_8_ = local_228.y.n[3];
          auVar100._8_8_ = 0;
          auVar100._0_8_ = uVar227;
          auVar194._8_8_ = 0;
          auVar194._0_8_ = local_228.y.n[4];
          auVar3 = (auVar2 >> 0x34) +
                   auVar100 * auVar194 + auVar99 * auVar193 + auVar98 * auVar192 +
                   auVar97 * auVar191;
          uVar224 = auVar3._0_8_;
          uVar225 = auVar3._8_8_;
          auVar216._8_8_ = uVar225 >> 0x34;
          auVar216._0_8_ = uVar225 * 0x1000 | uVar224 >> 0x34;
          auVar101._8_8_ = 0;
          auVar101._0_8_ = uVar224 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar2._6_2_ & 0xf);
          auVar3 = auVar96 * auVar190 + auVar101 * ZEXT816(0x1000003d1);
          uVar224 = auVar3._0_8_;
          uVar225 = auVar3._8_8_;
          local_260.n[0] = uVar224 & 0xfffffffffffff;
          auVar102._8_8_ = 0;
          auVar102._0_8_ = uVar227;
          auVar195._8_8_ = 0;
          auVar195._0_8_ = local_228.y.n[0];
          auVar103._8_8_ = 0;
          auVar103._0_8_ = uVar222;
          auVar196._8_8_ = 0;
          auVar196._0_8_ = local_228.y.n[1];
          auVar104._8_8_ = 0;
          auVar104._0_8_ = uVar223;
          auVar197._8_8_ = 0;
          auVar197._0_8_ = local_228.y.n[2];
          auVar207._8_8_ = uVar225 >> 0x34;
          auVar207._0_8_ = uVar225 * 0x1000 | uVar224 >> 0x34;
          auVar105._8_8_ = 0;
          auVar105._0_8_ = uVar221;
          auVar198._8_8_ = 0;
          auVar198._0_8_ = local_228.y.n[3];
          auVar106._8_8_ = 0;
          auVar106._0_8_ = uVar220;
          auVar199._8_8_ = 0;
          auVar199._0_8_ = local_228.y.n[4];
          auVar216 = auVar104 * auVar197 + auVar106 * auVar199 + auVar105 * auVar198 + auVar216;
          auVar107._8_8_ = 0;
          auVar107._0_8_ = auVar216._0_8_ & 0xfffffffffffff;
          auVar207 = auVar107 * ZEXT816(0x1000003d10) + auVar102 * auVar195 + auVar103 * auVar196 +
                     auVar207;
          local_260.n[1] = auVar207._0_8_ & 0xfffffffffffff;
          auVar108._8_8_ = 0;
          auVar108._0_8_ = uVar220;
          auVar200._8_8_ = 0;
          auVar200._0_8_ = local_228.y.n[0];
          auVar109._8_8_ = 0;
          auVar109._0_8_ = uVar227;
          auVar201._8_8_ = 0;
          auVar201._0_8_ = local_228.y.n[1];
          auVar110._8_8_ = 0;
          auVar110._0_8_ = uVar222;
          auVar202._8_8_ = 0;
          auVar202._0_8_ = local_228.y.n[2];
          auVar111._8_8_ = 0;
          auVar111._0_8_ = uVar223;
          auVar203._8_8_ = 0;
          auVar203._0_8_ = local_228.y.n[3];
          auVar112._8_8_ = 0;
          auVar112._0_8_ = uVar221;
          auVar204._8_8_ = 0;
          auVar204._0_8_ = local_228.y.n[4];
          auVar3 = auVar112 * auVar204 + auVar111 * auVar203 + (auVar216 >> 0x34);
          auVar113._8_8_ = 0;
          auVar113._0_8_ = auVar3._0_8_;
          auVar4 = auVar113 * ZEXT816(0x1000003d10) +
                   auVar108 * auVar200 + auVar110 * auVar202 + auVar109 * auVar201 +
                   (auVar207 >> 0x34);
          auVar5 = auVar4 >> 0x34;
          auVar218._8_8_ = 0;
          auVar218._0_8_ = auVar5._0_8_;
          local_260.n[2] = auVar4._0_8_ & 0xfffffffffffff;
          auVar114._8_8_ = 0;
          auVar114._0_8_ = auVar3._8_8_;
          auVar217._8_8_ = auVar5._8_8_;
          auVar217._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
          auVar218 = auVar114 * ZEXT816(0x1000003d10000) + auVar217 + auVar218;
          uVar220 = auVar218._0_8_;
          local_260.n[3] = uVar220 & 0xfffffffffffff;
          local_260.n[4] =
               (auVar218._8_8_ << 0xc | uVar220 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
          local_238 = 0;
          local_228.x.n[0] = local_288;
          local_228.x.n[1] = uStack_280;
          local_228.x.n[2] = local_278;
          local_228.x.n[3] = uStack_270;
          local_228.x.n[4] = local_268;
          local_228.y.n[0] = local_260.n[0];
          local_228.y.n[1] = local_260.n[1];
          local_228.y.n[2] = local_260.n[2];
          local_228.y.n[3] = local_260.n[3];
          local_228.y.n[4] = local_260.n[4];
          secp256k1_fe_impl_normalize_var(&local_260);
          if ((local_260.n[0] & 1) != 0) {
            return 0;
          }
          local_138.n[0] = (local_288 - local_2c8) + 0x3ffffbfffff0bc;
          local_138.n[1] = (uStack_280 - uStack_2c0) + 0x3ffffffffffffc;
          local_138.n[2] = (local_278 - local_2b8) + 0x3ffffffffffffc;
          local_138.n[3] = (uStack_270 - uStack_2b0) + 0x3ffffffffffffc;
          local_138.n[4] = (local_268 - local_168.n[4]) + 0x3fffffffffffc;
          iVar219 = secp256k1_fe_impl_normalizes_to_zero(&local_138);
          return iVar219;
        }
      }
    }
  }
  else {
    secp256k1_schnorrsig_verify_cold_2();
  }
  return 0;
}

Assistant:

int secp256k1_schnorrsig_verify(const secp256k1_context* ctx, const unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_scalar s;
    secp256k1_scalar e;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_gej pkj;
    secp256k1_fe rx;
    secp256k1_ge r;
    unsigned char buf[32];
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_fe_set_b32_limit(&rx, &sig64[0])) {
        return 0;
    }

    secp256k1_scalar_set_b32(&s, &sig64[32], &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }

    /* Compute e. */
    secp256k1_fe_get_b32(buf, &pk.x);
    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, buf);

    /* Compute rj =  s*G + (-e)*pkj */
    secp256k1_scalar_negate(&e, &e);
    secp256k1_gej_set_ge(&pkj, &pk);
    secp256k1_ecmult(&rj, &pkj, &e, &s);

    secp256k1_ge_set_gej_var(&r, &rj);
    if (secp256k1_ge_is_infinity(&r)) {
        return 0;
    }

    secp256k1_fe_normalize_var(&r.y);
    return !secp256k1_fe_is_odd(&r.y) &&
           secp256k1_fe_equal(&rx, &r.x);
}